

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::XMLLoader::loadAnimatedLight(XMLLoader *this,Ref<embree::XML> *xml)

{
  string *parmID;
  undefined8 uVar1;
  pointer pRVar2;
  int iVar3;
  int iVar4;
  Ref<embree::SceneGraph::Node> RVar5;
  LightNode *pLVar6;
  runtime_error *this_00;
  AnimatedLightNode *this_01;
  size_t *in_RDX;
  ulong uVar7;
  LightNode *pLVar8;
  long lVar9;
  ulong __n;
  allocator local_a5;
  undefined4 local_a4;
  size_t *local_a0;
  undefined1 local_98 [32];
  vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
  lights;
  Vec2f time_range;
  
  lVar9 = *(long *)(*in_RDX + 0x88) - *(long *)(*in_RDX + 0x80);
  if (lVar9 == 0) {
    (this->path).filename._M_dataplus._M_p = (pointer)0x0;
  }
  else {
    __n = lVar9 >> 3;
    local_a0 = in_RDX;
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::vector(&lights,__n,(allocator_type *)local_98);
    for (uVar7 = 0; __n != uVar7; uVar7 = uVar7 + 1) {
      XML::child((XML *)&time_range,*local_a0);
      RVar5 = loadLight((XMLLoader *)local_98,xml);
      uVar1 = local_98._0_8_;
      local_a4 = (undefined4)CONCAT71((int7)((ulong)RVar5.ptr >> 8),1);
      if ((long *)local_98._0_8_ == (long *)0x0) {
        pLVar8 = (LightNode *)0x0;
      }
      else {
        pLVar6 = (LightNode *)
                 __dynamic_cast(local_98._0_8_,&SceneGraph::Node::typeinfo,
                                &SceneGraph::LightNode::typeinfo,0);
        pLVar8 = (LightNode *)0x0;
        if (pLVar6 != (LightNode *)0x0) {
          (*(pLVar6->super_Node).super_RefCount._vptr_RefCount[2])(pLVar6);
          local_a4 = 0;
          pLVar8 = pLVar6;
        }
      }
      pRVar2 = lights.
               super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (lights.
          super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar7].ptr != (LightNode *)0x0) {
        (*((lights.
            super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7].ptr)->super_Node).super_RefCount.
          _vptr_RefCount[3])();
      }
      pRVar2[uVar7].ptr = pLVar8;
      if ((long *)uVar1 != (long *)0x0) {
        (**(code **)(*(long *)uVar1 + 0x18))(uVar1);
      }
      if (time_range.field_0 != (anon_union_8_2_4062524c_for_Vec2<float>_1)0x0) {
        (**(code **)(*(long *)time_range.field_0 + 0x18))();
      }
    }
    iVar3 = (*((lights.
                super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->ptr->super_Node).super_RefCount.
              _vptr_RefCount[0xf])();
    uVar7 = 1;
    while (uVar7 < __n) {
      iVar4 = (*((lights.
                  super__Vector_base<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].ptr)->super_Node).super_RefCount.
                _vptr_RefCount[0xf])();
      uVar7 = uVar7 + 1;
      if (iVar3 != iVar4) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        ParseLocation::str_abi_cxx11_((string *)&time_range,(ParseLocation *)(*local_a0 + 0x10));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &time_range,": light types do not match");
        std::runtime_error::runtime_error(this_00,(string *)local_98);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    parmID = (string *)*local_a0;
    std::__cxx11::string::string((string *)local_98,"time_range",&local_a5);
    XML::parm_Vec2f((XML *)&time_range,parmID);
    std::__cxx11::string::~string((string *)local_98);
    this_01 = (AnimatedLightNode *)::operator_new(0x88);
    SceneGraph::AnimatedLightNode::AnimatedLightNode(this_01,&lights,(BBox1f)time_range.field_0);
    (this->path).filename._M_dataplus._M_p = (pointer)this_01;
    (**(code **)(*(long *)&(this_01->super_LightNode).super_Node.super_RefCount + 0x10))(this_01);
    std::
    vector<embree::Ref<embree::SceneGraph::LightNode>,_std::allocator<embree::Ref<embree::SceneGraph::LightNode>_>_>
    ::~vector(&lights);
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> XMLLoader::loadAnimatedLight(const Ref<XML>& xml) 
  {
    size_t numLights = xml->size();
    if (numLights == 0)
      return nullptr;

    /* load list of lights */
    std::vector<Ref<SceneGraph::LightNode>> lights(numLights);
    for (size_t i=0; i<numLights; i++) 
      lights[i] = loadLight(xml->child(i)).dynamicCast<SceneGraph::LightNode>();

    /* check that all lights are of same type */
    auto light_type = lights[0]->getType();
    for (size_t i=1; i<numLights; i++) {
      if (light_type != lights[i]->getType())
        THROW_RUNTIME_ERROR(xml->loc.str()+": light types do not match");
    }

    const Vec2f time_range = xml->parm_Vec2f("time_range");
    return new SceneGraph::AnimatedLightNode(std::move(lights),BBox1f(time_range.x,time_range.y));
  }